

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O3

TestStatus *
vkt::wsi::anon_unknown_0::resizeSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  size_type *psVar1;
  VkInstance *ppVVar2;
  TestLog *log;
  TestStatus *pTVar3;
  Handle<(vk::HandleType)25> nativeDisplay;
  Handle<(vk::HandleType)25> nativeWindow;
  bool bVar4;
  int iVar5;
  qpTestResult qVar6;
  undefined4 extraout_var;
  VkSurfaceCapabilitiesKHR *pVVar7;
  long *plVar8;
  undefined8 *puVar9;
  long lVar10;
  long *plVar11;
  ulong *puVar12;
  ulong uVar13;
  ulong uVar14;
  VkSurfaceKHR surface;
  undefined1 auVar15 [16];
  int iVar16;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  ResultCollector results;
  VkSurfaceCapabilitiesKHR capabilities;
  InstanceHelper instHelper;
  string local_510;
  Display *local_4f0;
  ulong *local_4e8;
  long local_4e0;
  ulong local_4d8;
  long lStack_4d0;
  Vector<unsigned_int,_2> local_4c8;
  long *local_4c0;
  long local_4b8;
  long local_4b0;
  long lStack_4a8;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_4a0;
  ulong *local_488;
  long local_480;
  ulong local_478 [2];
  Display *local_468;
  InstanceInterface *pIStack_460;
  VkInstance local_458;
  VkAllocationCallbacks *pVStack_450;
  TestStatus *local_440;
  long local_438;
  Display *local_430;
  long *local_428 [2];
  long local_418 [2];
  ResultCollector local_408;
  uint local_3b8 [8];
  VkSurfaceCapabilitiesKHR local_398;
  Move<vk::Handle<(vk::HandleType)25>_> local_360 [3];
  ios_base local_2f0 [264];
  undefined1 local_1e8 [32];
  DestroyInstanceFunc p_Stack_1c8;
  VkAllocationCallbacks *local_1c0;
  InstanceDriver local_1b8;
  
  log = context->m_testCtx->m_log;
  local_440 = __return_storage_ptr__;
  local_1e8._0_8_ = local_1e8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
  tcu::ResultCollector::ResultCollector(&local_408,log,(string *)local_1e8);
  if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  InstanceHelper::InstanceHelper
            ((InstanceHelper *)local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  iVar5 = (*context->m_testCtx->m_platform->_vptr_Platform[5])();
  createDisplay((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)local_360,
                (Platform *)CONCAT44(extraout_var,iVar5),(Extensions *)local_1e8,wsiType);
  nativeDisplay.m_internal =
       local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal;
  local_398.minImageCount = 0;
  local_398.maxImageCount = 0;
  createWindow((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)local_360,
               (Display *)
               local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal,
               (Maybe<tcu::Vector<unsigned_int,_2>_> *)&local_398);
  nativeWindow.m_internal =
       local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal;
  local_4f0 = (Display *)
              local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal;
  ::vk::enumeratePhysicalDevices
            (&local_4a0,&local_1b8.super_InstanceInterface,(VkInstance)local_1e8._24_8_);
  ::vk::wsi::createSurface
            (local_360,&local_1b8.super_InstanceInterface,(VkInstance)local_1e8._24_8_,wsiType,
             (Display *)nativeDisplay.m_internal,(Window *)nativeWindow.m_internal,
             (VkAllocationCallbacks *)0x0);
  local_458 = local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.m_instance;
  pVStack_450 = local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.
                m_allocator;
  local_468 = (Display *)
              local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal;
  pIStack_460 = local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.
                m_instanceIface;
  local_3b8[0] = 0x40;
  local_3b8[1] = 0x40;
  local_3b8[2] = 0x7c;
  local_3b8[3] = 0x77;
  local_3b8[4] = 0x100;
  local_3b8[5] = 0x200;
  lVar10 = 0;
  do {
    local_4c8.m_data = *(uint (*) [2])(local_3b8 + lVar10 * 2);
    local_438 = lVar10;
    (*local_4f0->_vptr_Display[2])(local_4f0,&local_4c8);
    if (local_4a0.
        super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_4a0.
        super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      uVar14 = 0;
      local_430 = local_468;
      surface.m_internal = (deUint64)local_468;
      do {
        bVar4 = isSupportedByAnyQueue
                          (&local_1b8.super_InstanceInterface,
                           local_4a0.
                           super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14],surface);
        if (bVar4) {
          pVVar7 = ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
                             (&local_398,&local_1b8.super_InstanceInterface,
                              local_4a0.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar14],surface);
          iVar5 = -(uint)(local_4c8.m_data[0] == local_398.currentExtent.width);
          iVar16 = -(uint)(local_4c8.m_data[1] == local_398.currentExtent.height);
          auVar15._4_4_ = iVar5;
          auVar15._0_4_ = iVar5;
          auVar15._8_4_ = iVar16;
          auVar15._12_4_ = iVar16;
          iVar5 = movmskpd((int)pVVar7,auVar15);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
          ::vk::operator<<((ostream *)local_360,&local_398.currentExtent);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
          std::ios_base::~ios_base(local_2f0);
          plVar8 = (long *)std::__cxx11::string::replace((ulong)local_428,0,(char *)0x0,0xb3c856);
          local_4c0 = &local_4b0;
          plVar11 = plVar8 + 2;
          if ((long *)*plVar8 == plVar11) {
            local_4b0 = *plVar11;
            lStack_4a8 = plVar8[3];
          }
          else {
            local_4b0 = *plVar11;
            local_4c0 = (long *)*plVar8;
          }
          local_4b8 = plVar8[1];
          *plVar8 = (long)plVar11;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          plVar8 = (long *)std::__cxx11::string::append((char *)&local_4c0);
          local_4e8 = &local_4d8;
          puVar12 = (ulong *)(plVar8 + 2);
          if ((ulong *)*plVar8 == puVar12) {
            local_4d8 = *puVar12;
            lStack_4d0 = plVar8[3];
          }
          else {
            local_4d8 = *puVar12;
            local_4e8 = (ulong *)*plVar8;
          }
          local_4e0 = plVar8[1];
          *plVar8 = (long)puVar12;
          plVar8[1] = 0;
          *(undefined1 *)(plVar8 + 2) = 0;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
          tcu::operator<<((ostream *)local_360,&local_4c8);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
          std::ios_base::~ios_base(local_2f0);
          uVar13 = 0xf;
          if (local_4e8 != &local_4d8) {
            uVar13 = local_4d8;
          }
          if (uVar13 < (ulong)(local_480 + local_4e0)) {
            uVar13 = 0xf;
            if (local_488 != local_478) {
              uVar13 = local_478[0];
            }
            if (uVar13 < (ulong)(local_480 + local_4e0)) goto LAB_0073f93c;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_488,0,(char *)0x0,(ulong)local_4e8)
            ;
          }
          else {
LAB_0073f93c:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append((char *)&local_4e8,(ulong)local_488);
          }
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
          psVar1 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar1) {
            local_510.field_2._M_allocated_capacity = *psVar1;
            local_510.field_2._8_8_ = puVar9[3];
          }
          else {
            local_510.field_2._M_allocated_capacity = *psVar1;
            local_510._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_510._M_string_length = puVar9[1];
          *puVar9 = psVar1;
          puVar9[1] = 0;
          *(undefined1 *)psVar1 = 0;
          tcu::ResultCollector::check(&local_408,iVar5 == 3,&local_510);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
          }
          surface.m_internal = (deUint64)local_430;
          if (local_488 != local_478) {
            operator_delete(local_488,local_478[0] + 1);
          }
          if (local_4e8 != &local_4d8) {
            operator_delete(local_4e8,local_4d8 + 1);
          }
          if (local_4c0 != &local_4b0) {
            operator_delete(local_4c0,local_4b0 + 1);
          }
          if (local_428[0] != local_418) {
            operator_delete(local_428[0],local_418[0] + 1);
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < (ulong)((long)local_4a0.
                                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_4a0.
                                      super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    lVar10 = local_438 + 1;
    if (lVar10 == 3) {
      qVar6 = tcu::ResultCollector::getResult(&local_408);
      ppVVar2 = &local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter.
                 m_instance;
      local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal =
           (deUint64)ppVVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_360,local_408.m_message._M_dataplus._M_p,
                 local_408.m_message._M_dataplus._M_p + local_408.m_message._M_string_length);
      pTVar3 = local_440;
      local_440->m_code = qVar6;
      (local_440->m_description)._M_dataplus._M_p = (pointer)&(local_440->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_440->m_description,
                 local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.
                 m_internal,
                 (undefined1 *)
                 ((long)&(local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.deleter
                         .m_instanceIface)->_vptr_InstanceInterface +
                 local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.
                 m_internal));
      if ((VkInstance *)
          local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.object.m_internal !=
          ppVVar2) {
        operator_delete((void *)local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.
                                object.m_internal,
                        (ulong)(local_360[0].super_RefBase<vk::Handle<(vk::HandleType)25>_>.m_data.
                                deleter.m_instance + 1));
      }
      if (local_468 != (Display *)0x0) {
        (*pIStack_460->_vptr_InstanceInterface[0xd])(pIStack_460,local_458,local_468,pVStack_450);
      }
      if (local_4a0.
          super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4a0.
                        super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_4a0.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_4a0.
                              super__Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      (*local_4f0->_vptr_Display[1])();
      (*(*(_func_int ***)nativeDisplay.m_internal)[1])();
      ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
      if ((VkInstance)local_1e8._24_8_ != (VkInstance)0x0) {
        (*p_Stack_1c8)((VkInstance)local_1e8._24_8_,local_1c0);
      }
      local_1e8._24_8_ = 0;
      p_Stack_1c8 = (DestroyInstanceFunc)0x0;
      local_1c0 = (VkAllocationCallbacks *)0x0;
      if ((pointer)local_1e8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ - local_1e8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408.m_message._M_dataplus._M_p != &local_408.m_message.field_2) {
        operator_delete(local_408.m_message._M_dataplus._M_p,
                        local_408.m_message.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408.m_prefix._M_dataplus._M_p != &local_408.m_prefix.field_2) {
        operator_delete(local_408.m_prefix._M_dataplus._M_p,
                        local_408.m_prefix.field_2._M_allocated_capacity + 1);
      }
      return pTVar3;
    }
  } while( true );
}

Assistant:

tcu::TestStatus resizeSurfaceTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log				= context.getTestContext().getLog();
	tcu::ResultCollector			results			(log);

	const InstanceHelper			instHelper		(context, wsiType);

	const UniquePtr<Display>		nativeDisplay	(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(),
																   instHelper.supportedExtensions,
																   wsiType));
	UniquePtr<Window>				nativeWindow	(createWindow(*nativeDisplay, tcu::nothing<UVec2>()));

	const vector<VkPhysicalDevice>	physicalDevices	= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);
	const Unique<VkSurfaceKHR>		surface			(createSurface(instHelper.vki, *instHelper.instance, wsiType, *nativeDisplay, *nativeWindow));

	const UVec2						sizes[]			=
	{
		UVec2(64, 64),
		UVec2(124, 119),
		UVec2(256, 512)
	};

	DE_ASSERT(getPlatformProperties(wsiType).features & PlatformProperties::FEATURE_RESIZE_WINDOW);

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); ++sizeNdx)
	{
		const UVec2		testSize	= sizes[sizeNdx];

		try
		{
			nativeWindow->resize(testSize);
		}
		catch (const tcu::Exception& e)
		{
			// Make sure all exception types result in a test failure
			results.fail(e.getMessage());
		}

		for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
		{
			if (isSupportedByAnyQueue(instHelper.vki, physicalDevices[deviceNdx], *surface))
			{
				const VkSurfaceCapabilitiesKHR	capabilities	= getPhysicalDeviceSurfaceCapabilities(instHelper.vki, physicalDevices[deviceNdx], *surface);

				// \note Assumes that surface size is NOT set by swapchain if initial window size is honored by platform
				results.check(capabilities.currentExtent.width == testSize.x() &&
								capabilities.currentExtent.height == testSize.y(),
								"currentExtent " + de::toString(capabilities.currentExtent) + " doesn't match requested size " + de::toString(testSize));
			}
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}